

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::SEES_PDU::~SEES_PDU(SEES_PDU *this)

{
  SEES_PDU *this_local;
  
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__SEES_PDU_00331c58;
  std::vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
  ::clear(&this->m_vPropSys);
  std::
  vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
  ::clear(&this->m_vVecNozzleSys);
  std::
  vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
  ::~vector(&this->m_vVecNozzleSys);
  std::vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
  ::~vector(&this->m_vPropSys);
  DATA_TYPE::EntityIdentifier::~EntityIdentifier(&this->m_OriginatingEntity);
  Header7::~Header7(&this->super_Header);
  return;
}

Assistant:

SEES_PDU::~SEES_PDU()
{
    m_vPropSys.clear();
    m_vVecNozzleSys.clear();
}